

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.c
# Opt level: O0

simple_token * tokenize_text(char *source,size_t start,size_t len,int format)

{
  simple_token *chain_start;
  char *stop_00;
  char *local_78;
  char *last_stop;
  char *stop;
  simple_token *root;
  simple_token *t;
  undefined1 auStack_50 [4];
  int type;
  Scanner s;
  int format_local;
  size_t len_local;
  size_t start_local;
  char *source_local;
  
  _auStack_50 = source + start;
  root = (simple_token *)0x0;
  s.start = _auStack_50;
  s.ctx._4_4_ = format;
  chain_start = simple_token_new(0,start,len);
  stop_00 = _auStack_50 + len;
  local_78 = _auStack_50;
  do {
    if (s.ctx._4_4_ == 0) {
      t._4_4_ = scan_csv((Scanner *)auStack_50,stop_00);
    }
    else {
      if (s.ctx._4_4_ != 1) {
        fprintf(_stderr,"ERROR.  %d is not a valid parsing format.\n",(ulong)s.ctx._4_4_);
        return (simple_token *)0x0;
      }
      t._4_4_ = scan_tsv((Scanner *)auStack_50,stop_00);
    }
    if (_auStack_50 == local_78) {
      if ((t._4_4_ == 0) && (local_78 < stop_00)) {
        root = simple_token_new(1,(long)local_78 - (long)source,(long)stop_00 - (long)local_78);
        simple_token_chain_append(chain_start,root);
      }
    }
    else if (t._4_4_ == 0) {
      if (local_78 < stop_00) {
        root = simple_token_new(1,(long)local_78 - (long)source,(long)stop_00 - (long)local_78);
        simple_token_chain_append(chain_start,root);
      }
    }
    else {
      root = simple_token_new(1,(long)local_78 - (long)source,(long)_auStack_50 - (long)local_78);
      simple_token_chain_append(chain_start,root);
    }
    if (t._4_4_ == 0) {
      if (((root != (simple_token *)0x0) && (root->tail != (simple_token *)0x0)) &&
         (root->tail->type != 4)) {
        root = simple_token_new(4,(long)_auStack_50 - (long)source,(long)s.start - (long)_auStack_50
                               );
        simple_token_chain_append(chain_start,root);
      }
    }
    else {
      root = simple_token_new((unsigned_short)t._4_4_,(long)_auStack_50 - (long)source,
                              (long)s.start - (long)_auStack_50);
      simple_token_chain_append(chain_start,root);
    }
    local_78 = s.start;
  } while (t._4_4_ != 0);
  return chain_start;
}

Assistant:

simple_token * tokenize_text(const char * source, size_t start, size_t len, int format) {

	// Create re2c scanner
	Scanner s;
	s.start = &source[start];		// Start parsing
	s.cur = s.start;

	int type;						// TOKEN type
	simple_token * t = NULL;		// Create token chain
	simple_token * root = simple_token_new(0, start, len);

	// Where do we stop parsing?
	const char * stop = s.start + len;

	// Remember last token to catch other text
	const char * last_stop = s.start;


	do {
		switch (format) {
			case FORMAT_CSV:
				type = scan_csv(&s, stop);
				break;

			case FORMAT_TSV:
				type = scan_tsv(&s, stop);
				break;

			default:
				// Error
				fprintf(stderr, "ERROR.  %d is not a valid parsing format.\n", format);
				return NULL;
				break;
		}

		if (s.start != last_stop) {
			// We skipped characters between tokens

			if (type) {
				t = simple_token_new(TEXT_PLAIN, (size_t)(last_stop - source), (size_t)(s.start - last_stop));
				simple_token_chain_append(root, t);
			} else {
				if (stop > last_stop) {
					// Source text ended without final token

					t = simple_token_new(TEXT_PLAIN, (size_t)(last_stop - source), (size_t)(stop - last_stop));
					simple_token_chain_append(root, t);
				}
			}
		} else if (type == 0 && stop > last_stop) {
			// Source text ended without final token

			t = simple_token_new(TEXT_PLAIN, (size_t)(last_stop - source), (size_t)(stop - last_stop));
			simple_token_chain_append(root, t);
		}

		switch (type) {
			case 0:

				// Source finished
				if (t && t->tail && (t->tail->type != TDP_EOF)) {
					t = simple_token_new(TDP_EOF, (size_t)(s.start - source), (size_t)(s.cur - s.start));
					simple_token_chain_append(root, t);
				}

				break;

			default:
				t = simple_token_new(type, (size_t)(s.start - source), (size_t)(s.cur - s.start));
				simple_token_chain_append(root, t);
				break;
		}

		// Remember where token ends to detect skipped characters
		last_stop = s.cur;
	} while (type != 0);

	return root;
}